

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O1

void initRustData(void)

{
  QMultiHash<char,_QLatin1String> QVar1;
  QMultiHash<char,_QLatin1String> QVar2;
  QMultiHash<char,_QLatin1String> QVar3;
  QMultiHash<char,_QLatin1String> QVar4;
  Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *pDVar5;
  long lVar6;
  QMultiHash<char,_QLatin1String> moved;
  char local_509;
  QMultiHash<char,_QLatin1String> local_508;
  iterator local_4f8;
  undefined1 local_4e0 [16];
  char *local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_448;
  char *local_440;
  undefined1 local_438;
  undefined8 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  char *local_410;
  undefined1 local_408;
  undefined8 local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined1 local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_4e0[0] = 0x61;
  local_4e0._8_8_ = 8;
  local_4d0 = "abstract";
  local_4c8 = 0x61;
  local_4c0 = 7;
  local_4b8 = "alignof";
  local_4b0 = 0x61;
  local_4a8 = 2;
  local_4a0 = "as";
  local_498 = 0x61;
  local_490 = 5;
  local_488 = "async";
  local_480 = 0x61;
  local_478 = 5;
  local_470 = "await";
  local_468 = 0x62;
  local_460 = 2;
  local_458 = "be";
  local_450 = 0x62;
  local_448 = 3;
  local_440 = "box";
  local_438 = 0x62;
  local_430 = 5;
  local_428 = "break";
  local_420 = 99;
  local_418 = 5;
  local_410 = "const";
  local_408 = 99;
  local_400 = 8;
  local_3f8 = "continue";
  local_3f0 = 99;
  local_3e8 = 5;
  local_3e0 = "crate";
  local_3d8 = 100;
  local_3d0 = 2;
  local_3c8 = "do";
  local_3c0 = 100;
  local_3b8 = 3;
  local_3b0 = "dyn";
  local_3a8 = 0x65;
  local_3a0 = 4;
  local_398 = "else";
  local_390 = 0x65;
  local_388 = 6;
  local_380 = "extern";
  local_378 = 0x66;
  local_370 = 5;
  local_368 = "final";
  local_360 = 0x66;
  local_358 = 2;
  local_350 = "fn";
  local_348 = 0x66;
  local_340 = 3;
  local_338 = "for";
  local_330 = 0x69;
  local_328 = 2;
  local_320 = "if";
  local_318 = 0x69;
  local_310 = 4;
  local_308 = "impl";
  local_300 = 0x69;
  local_2f8 = 2;
  local_2f0 = "in";
  local_2e8 = 0x6c;
  local_2e0 = 3;
  local_2d8 = "let";
  local_2d0 = 0x6c;
  local_2c8 = 4;
  local_2c0 = "loop";
  local_2b8 = 0x6d;
  local_2b0 = 5;
  local_2a8 = "match";
  local_2a0 = 0x6d;
  local_298 = 3;
  local_290 = "mod";
  local_288 = 0x6d;
  local_280 = 4;
  local_278 = "move";
  local_270 = 0x6d;
  local_268 = 3;
  local_260 = "mut";
  local_258 = 0x6f;
  local_250 = 8;
  local_248 = "offsetof";
  local_240 = 0x6f;
  local_238 = 4;
  local_230 = "once";
  local_228 = 0x6f;
  local_220 = 8;
  local_218 = "override";
  local_210 = 0x70;
  local_208 = 4;
  local_200 = "priv";
  local_1f8 = 0x70;
  local_1f0 = 3;
  local_1e8 = "pub";
  local_1e0 = 0x70;
  local_1d8 = 4;
  local_1d0 = "pure";
  local_1c8 = 0x72;
  local_1c0 = 3;
  local_1b8 = "ref";
  local_1b0 = 0x72;
  local_1a8 = 6;
  local_1a0 = "return";
  local_198 = 0x73;
  local_190 = 6;
  local_188 = "sizeof";
  local_180 = 0x73;
  local_178 = 6;
  local_170 = "static";
  local_168 = 0x73;
  local_160 = 4;
  local_158 = "self";
  local_150 = 0x53;
  local_148 = 4;
  local_140 = "Self";
  local_138 = 0x73;
  local_130 = 5;
  local_128 = "super";
  local_120 = 0x74;
  local_118 = 5;
  local_110 = "trait";
  local_108 = 0x74;
  local_100 = 4;
  local_f8 = "type";
  local_f0 = 0x74;
  local_e8 = 6;
  local_e0 = "typeof";
  local_d8 = 0x75;
  local_d0 = 6;
  local_c8 = "unsafe";
  local_c0 = 0x75;
  local_b8 = 7;
  local_b0 = "unsized";
  local_a8 = 0x75;
  local_a0 = 3;
  local_98 = "use";
  local_90 = 0x76;
  local_88 = 7;
  local_80 = "virtual";
  local_78 = 0x77;
  local_70 = 5;
  local_68 = "where";
  local_60 = 0x77;
  local_58 = 5;
  local_50 = "while";
  local_48 = 0x79;
  local_40 = 5;
  local_38 = "yield";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x32);
  local_508.m_size = 0;
  lVar6 = 0;
  local_508.d = pDVar5;
  do {
    local_509 = local_4e0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_4f8,&local_508,&local_509,(QLatin1String *)(local_4e0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x4b0);
  QVar1.m_size = local_508.m_size;
  QVar1.d = local_508.d;
  local_508.d = (Data *)0x0;
  local_508.m_size = 0;
  local_4f8.i.d = rust_keywords.d;
  local_4f8.i.bucket = rust_keywords.m_size;
  rust_keywords = QVar1;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_4f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_508);
  local_4e0[0] = 0x75;
  local_4e0._8_8_ = 5;
  local_4d0 = "union";
  local_4c8 = 0x65;
  local_4c0 = 4;
  local_4b8 = "enum";
  local_4b0 = 0x73;
  local_4a8 = 6;
  local_4a0 = "struct";
  local_498 = 0x69;
  local_490 = 2;
  local_488 = "i8";
  local_480 = 0x69;
  local_478 = 3;
  local_470 = "i16";
  local_468 = 0x69;
  local_460 = 3;
  local_458 = "i32";
  local_450 = 0x69;
  local_448 = 3;
  local_440 = "i64";
  local_438 = 0x69;
  local_430 = 4;
  local_428 = "i128";
  local_420 = 0x69;
  local_418 = 5;
  local_410 = "isize";
  local_408 = 0x75;
  local_400 = 2;
  local_3f8 = "u8";
  local_3f0 = 0x75;
  local_3e8 = 3;
  local_3e0 = "u16";
  local_3d8 = 0x75;
  local_3d0 = 3;
  local_3c8 = "u32";
  local_3c0 = 0x75;
  local_3b8 = 3;
  local_3b0 = "u64";
  local_3a8 = 0x75;
  local_3a0 = 4;
  local_398 = "u128";
  local_390 = 0x75;
  local_388 = 5;
  local_380 = "usize";
  local_378 = 0x66;
  local_370 = 3;
  local_368 = "f32";
  local_360 = 0x66;
  local_358 = 3;
  local_350 = "f64";
  local_348 = 0x73;
  local_340 = 3;
  local_338 = "str";
  local_330 = 99;
  local_328 = 4;
  local_320 = "char";
  local_318 = 0x62;
  local_310 = 4;
  local_308 = "bool";
  local_300 = 0x42;
  local_2f8 = 3;
  local_2f0 = "Box";
  local_2e8 = 0x4f;
  local_2e0 = 6;
  local_2d8 = "Option";
  local_2d0 = 0x52;
  local_2c8 = 6;
  local_2c0 = "Result";
  local_2b8 = 0x53;
  local_2b0 = 6;
  local_2a8 = "String";
  local_2a0 = 0x56;
  local_298 = 3;
  local_290 = "Vec";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x19);
  local_508.m_size = 0;
  lVar6 = 0;
  local_508.d = pDVar5;
  do {
    local_509 = local_4e0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_4f8,&local_508,&local_509,(QLatin1String *)(local_4e0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 600);
  QVar2.m_size = local_508.m_size;
  QVar2.d = local_508.d;
  local_508.d = (Data *)0x0;
  local_508.m_size = 0;
  local_4f8.i.d = rust_types.d;
  local_4f8.i.bucket = rust_types.m_size;
  rust_types = QVar2;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_4f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_508);
  local_4e0[0] = 0x66;
  local_4e0._8_8_ = 5;
  local_4d0 = "false";
  local_4c8 = 0x74;
  local_4c0 = 4;
  local_4b8 = "true";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,2);
  local_508.m_size = 0;
  lVar6 = 0;
  local_508.d = pDVar5;
  do {
    local_509 = local_4e0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_4f8,&local_508,&local_509,(QLatin1String *)(local_4e0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x30);
  QVar3.m_size = local_508.m_size;
  QVar3.d = local_508.d;
  local_508.d = (Data *)0x0;
  local_508.m_size = 0;
  local_4f8.i.d = rust_literals.d;
  local_4f8.i.bucket = rust_literals.m_size;
  rust_literals = QVar3;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_4f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_508);
  local_4f8.i = (piter)ZEXT816(0);
  local_4e0._8_8_ = rust_builtin.m_size;
  local_4e0._0_8_ = rust_builtin.d;
  rust_builtin.d = (Data *)0x0;
  rust_builtin.m_size = 0;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_4e0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_4f8);
  local_4e0[0] = 0x61;
  local_4e0._8_8_ = 7;
  local_4d0 = "assert!";
  local_4c8 = 0x61;
  local_4c0 = 10;
  local_4b8 = "assert_eq!";
  local_4b0 = 0x62;
  local_4a8 = 9;
  local_4a0 = "bitflags!";
  local_498 = 0x62;
  local_490 = 6;
  local_488 = "bytes!";
  local_480 = 99;
  local_478 = 4;
  local_470 = "cfg!";
  local_468 = 99;
  local_460 = 4;
  local_458 = "col!";
  local_450 = 99;
  local_448 = 7;
  local_440 = "concat!";
  local_438 = 99;
  local_430 = 0xe;
  local_428 = "concat_idents!";
  local_420 = 100;
  local_418 = 0xd;
  local_410 = "debug_assert!";
  local_408 = 100;
  local_400 = 0x10;
  local_3f8 = "debug_assert_eq!";
  local_3f0 = 0x65;
  local_3e8 = 4;
  local_3e0 = "env!";
  local_3d8 = 0x70;
  local_3d0 = 6;
  local_3c8 = "panic!";
  local_3c0 = 0x66;
  local_3b8 = 5;
  local_3b0 = "file!";
  local_3a8 = 0x66;
  local_3a0 = 7;
  local_398 = "format!";
  local_390 = 0x66;
  local_388 = 0xc;
  local_380 = "format_args!";
  local_378 = 0x69;
  local_370 = 0xc;
  local_368 = "include_bin!";
  local_360 = 0x69;
  local_358 = 0xc;
  local_350 = "include_str!";
  local_348 = 0x6c;
  local_340 = 5;
  local_338 = "line!";
  local_330 = 0x6c;
  local_328 = 0xf;
  local_320 = "local_data_key!";
  local_318 = 0x6d;
  local_310 = 0xc;
  local_308 = "module_path!";
  local_300 = 0x6f;
  local_2f8 = 0xb;
  local_2f0 = "option_env!";
  local_2e8 = 0x70;
  local_2e0 = 6;
  local_2d8 = "print!";
  local_2d0 = 0x70;
  local_2c8 = 8;
  local_2c0 = "println!";
  local_2b8 = 0x73;
  local_2b0 = 7;
  local_2a8 = "select!";
  local_2a0 = 0x73;
  local_298 = 10;
  local_290 = "stringify!";
  local_288 = 0x74;
  local_280 = 4;
  local_278 = "try!";
  local_270 = 0x75;
  local_268 = 0xe;
  local_260 = "unimplemented!";
  local_258 = 0x75;
  local_250 = 0xc;
  local_248 = "unreachable!";
  local_240 = 0x76;
  local_238 = 4;
  local_230 = "vec!";
  local_228 = 0x77;
  local_220 = 6;
  local_218 = "write!";
  local_210 = 0x77;
  local_208 = 8;
  local_200 = "writeln!";
  local_1f8 = 0x6d;
  local_1f0 = 0xc;
  local_1e8 = "macro_rules!";
  local_1e0 = 0x61;
  local_1d8 = 10;
  local_1d0 = "assert_ne!";
  local_1c8 = 100;
  local_1c0 = 0x10;
  local_1b8 = "debug_assert_ne!";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x22);
  local_508.m_size = 0;
  lVar6 = 0;
  local_508.d = pDVar5;
  do {
    local_509 = local_4e0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_4f8,&local_508,&local_509,(QLatin1String *)(local_4e0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x330);
  QVar4.m_size = local_508.m_size;
  QVar4.d = local_508.d;
  local_508.d = (Data *)0x0;
  local_508.m_size = 0;
  local_4f8.i.d = rust_other.d;
  local_4f8.i.bucket = rust_other.m_size;
  rust_other = QVar4;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_4f8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_508);
  return;
}

Assistant:

void initRustData() {
    rust_keywords = {
        {('a'), QLatin1String("abstract")}, {('a'), QLatin1String("alignof")},
        {('a'), QLatin1String("as")},       {('a'), QLatin1String("async")},
        {('a'), QLatin1String("await")},    {('b'), QLatin1String("be")},
        {('b'), QLatin1String("box")},      {('b'), QLatin1String("break")},
        {('c'), QLatin1String("const")},    {('c'), QLatin1String("continue")},
        {('c'), QLatin1String("crate")},    {('d'), QLatin1String("do")},
        {('d'), QLatin1String("dyn")},      {('e'), QLatin1String("else")},
        {('e'), QLatin1String("extern")},   {('f'), QLatin1String("final")},
        {('f'), QLatin1String("fn")},       {('f'), QLatin1String("for")},
        {('i'), QLatin1String("if")},       {('i'), QLatin1String("impl")},
        {('i'), QLatin1String("in")},       {('l'), QLatin1String("let")},
        {('l'), QLatin1String("loop")},     {('m'), QLatin1String("match")},
        {('m'), QLatin1String("mod")},      {('m'), QLatin1String("move")},
        {('m'), QLatin1String("mut")},      {('o'), QLatin1String("offsetof")},
        {('o'), QLatin1String("once")},     {('o'), QLatin1String("override")},
        {('p'), QLatin1String("priv")},     {('p'), QLatin1String("pub")},
        {('p'), QLatin1String("pure")},     {('r'), QLatin1String("ref")},
        {('r'), QLatin1String("return")},   {('s'), QLatin1String("sizeof")},
        {('s'), QLatin1String("static")},   {('s'), QLatin1String("self")},
        {('S'), QLatin1String("Self")},     {('s'), QLatin1String("super")},
        {('t'), QLatin1String("trait")},    {('t'), QLatin1String("type")},
        {('t'), QLatin1String("typeof")},   {('u'), QLatin1String("unsafe")},
        {('u'), QLatin1String("unsized")},  {('u'), QLatin1String("use")},
        {('v'), QLatin1String("virtual")},  {('w'), QLatin1String("where")},
        {('w'), QLatin1String("while")},    {('y'), QLatin1String("yield")},
    };

    rust_types = {
        {('u'), QLatin1String("union")},  {('e'), QLatin1String("enum")},
        {('s'), QLatin1String("struct")},

        {('i'), QLatin1String("i8")},     {('i'), QLatin1String("i16")},
        {('i'), QLatin1String("i32")},    {('i'), QLatin1String("i64")},
        {('i'), QLatin1String("i128")},   {('i'), QLatin1String("isize")},
        {('u'), QLatin1String("u8")},     {('u'), QLatin1String("u16")},
        {('u'), QLatin1String("u32")},    {('u'), QLatin1String("u64")},
        {('u'), QLatin1String("u128")},   {('u'), QLatin1String("usize")},
        {('f'), QLatin1String("f32")},    {('f'), QLatin1String("f64")},
        {('s'), QLatin1String("str")},    {('c'), QLatin1String("char")},
        {('b'), QLatin1String("bool")},   {('B'), QLatin1String("Box")},
        {('O'), QLatin1String("Option")}, {('R'), QLatin1String("Result")},
        {('S'), QLatin1String("String")}, {('V'), QLatin1String("Vec")}};

    rust_literals = {{('f'), QLatin1String("false")},
                     {('t'), QLatin1String("true")}};

    rust_builtin = {

    };

    rust_other = {{('a'), QLatin1String("assert!")},
                  {('a'), QLatin1String("assert_eq!")},
                  {('b'), QLatin1String("bitflags!")},
                  {('b'), QLatin1String("bytes!")},
                  {('c'), QLatin1String("cfg!")},
                  {('c'), QLatin1String("col!")},
                  {('c'), QLatin1String("concat!")},
                  {('c'), QLatin1String("concat_idents!")},
                  {('d'), QLatin1String("debug_assert!")},
                  {('d'), QLatin1String("debug_assert_eq!")},
                  {('e'), QLatin1String("env!")},
                  {('p'), QLatin1String("panic!")},
                  {('f'), QLatin1String("file!")},
                  {('f'), QLatin1String("format!")},
                  {('f'), QLatin1String("format_args!")},
                  {('i'), QLatin1String("include_bin!")},
                  {('i'), QLatin1String("include_str!")},
                  {('l'), QLatin1String("line!")},
                  {('l'), QLatin1String("local_data_key!")},
                  {('m'), QLatin1String("module_path!")},
                  {('o'), QLatin1String("option_env!")},
                  {('p'), QLatin1String("print!")},
                  {('p'), QLatin1String("println!")},
                  {('s'), QLatin1String("select!")},
                  {('s'), QLatin1String("stringify!")},
                  {('t'), QLatin1String("try!")},
                  {('u'), QLatin1String("unimplemented!")},
                  {('u'), QLatin1String("unreachable!")},
                  {('v'), QLatin1String("vec!")},
                  {('w'), QLatin1String("write!")},
                  {('w'), QLatin1String("writeln!")},
                  {('m'), QLatin1String("macro_rules!")},
                  {('a'), QLatin1String("assert_ne!")},
                  {('d'), QLatin1String("debug_assert_ne!")}};
}